

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O3

int LoadEnv(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  interval *piVar5;
  double d0;
  double d2;
  double d1;
  double d3;
  char line [1024];
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  box local_500;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  byte local_4c8;
  char local_4c7;
  interval local_c0;
  interval local_a8;
  interval local_90;
  interval local_78;
  interval local_60;
  interval local_48;
  
  local_520 = 0.0;
  local_510 = 0.0;
  local_518 = 0.0;
  local_508 = 0.0;
  memset(&local_4c8,0,0x400);
  angle_env = 0.0;
  lat_env = 0.0;
  long_env = 0.0;
  alt_env = 0.0;
  MagneticDeclination = 0.0;
  AirPressure = 1.0;
  WaterVelocityOfSound = 1500.0;
  WaterFloorAltitude = 0.0;
  nb_circles = 0;
  if (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  nb_walls = 0;
  if (walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_4d0 = -10.0;
  local_4d8 = 10.0;
  interval::interval(&local_48,&local_4d0,&local_4d8);
  local_4e0 = -10.0;
  local_4e8 = 10.0;
  interval::interval(&local_60,&local_4e0,&local_4e8);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_48,
           (vector<interval,_std::allocator<interval>_> *)&local_60);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
  csMap.xMin = -10.0;
  csMap.xMax = 10.0;
  csMap.yMin = -10.0;
  csMap.yMax = 10.0;
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("Configuration file not found.");
    return 1;
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123668;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_0012368a;
    }
    if (local_4c8 != 0x23) break;
LAB_00123668:
    if (pcVar4 == (char *)0x0) goto LAB_0012368f;
  }
  if (local_4c8 == 0x24) goto LAB_0012368f;
LAB_0012368a:
  if (pcVar4 == (char *)0x0) {
LAB_0012368f:
    puts("Error reading parameter : d0.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&local_520);
  if (iVar2 != 1) {
    puts("Invalid parameter : d0.");
  }
  angle_env = (local_520 * -3.141592653589793) / 180.0 + 1.5707963267948966;
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123724;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123730;
    }
    if (local_4c8 != 0x23) break;
LAB_00123724:
    if (pcVar4 == (char *)0x0) goto LAB_00123735;
  }
  if (local_4c8 == 0x24) goto LAB_00123735;
LAB_00123730:
  if (pcVar4 == (char *)0x0) {
LAB_00123735:
    puts("Error reading parameter : lat_env.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&lat_env);
  if (iVar2 != 1) {
    puts("Invalid parameter : lat_env.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_001237a8;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_001237b4;
    }
    if (local_4c8 != 0x23) break;
LAB_001237a8:
    if (pcVar4 == (char *)0x0) goto LAB_001237b9;
  }
  if (local_4c8 == 0x24) goto LAB_001237b9;
LAB_001237b4:
  if (pcVar4 == (char *)0x0) {
LAB_001237b9:
    puts("Error reading parameter : long_env.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&long_env);
  if (iVar2 != 1) {
    puts("Invalid parameter : long_env.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_0012382c;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123838;
    }
    if (local_4c8 != 0x23) break;
LAB_0012382c:
    if (pcVar4 == (char *)0x0) goto LAB_0012383d;
  }
  if (local_4c8 == 0x24) goto LAB_0012383d;
LAB_00123838:
  if (pcVar4 == (char *)0x0) {
LAB_0012383d:
    puts("Error reading parameter : alt_env.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&alt_env);
  if (iVar2 != 1) {
    puts("Invalid parameter : alt_env.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_001238b0;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_001238bc;
    }
    if (local_4c8 != 0x23) break;
LAB_001238b0:
    if (pcVar4 == (char *)0x0) goto LAB_001238c1;
  }
  if (local_4c8 == 0x24) goto LAB_001238c1;
LAB_001238bc:
  if (pcVar4 == (char *)0x0) {
LAB_001238c1:
    puts("Error reading parameter : MagneticDeclination.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&MagneticDeclination);
  if (iVar2 != 1) {
    puts("Invalid parameter : MagneticDeclination.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123934;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123940;
    }
    if (local_4c8 != 0x23) break;
LAB_00123934:
    if (pcVar4 == (char *)0x0) goto LAB_00123945;
  }
  if (local_4c8 == 0x24) goto LAB_00123945;
LAB_00123940:
  if (pcVar4 == (char *)0x0) {
LAB_00123945:
    puts("Error reading parameter : AirPressure.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&AirPressure);
  if (iVar2 != 1) {
    puts("Invalid parameter : AirPressure.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_001239b8;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_001239c4;
    }
    if (local_4c8 != 0x23) break;
LAB_001239b8:
    if (pcVar4 == (char *)0x0) goto LAB_001239c9;
  }
  if (local_4c8 == 0x24) goto LAB_001239c9;
LAB_001239c4:
  if (pcVar4 == (char *)0x0) {
LAB_001239c9:
    puts("Error reading parameter : WaterVelocityOfSound.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&WaterVelocityOfSound);
  if (iVar2 != 1) {
    puts("Invalid parameter : WaterVelocityOfSound.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123a3c;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123a48;
    }
    if (local_4c8 != 0x23) break;
LAB_00123a3c:
    if (pcVar4 == (char *)0x0) goto LAB_00123a4d;
  }
  if (local_4c8 == 0x24) goto LAB_00123a4d;
LAB_00123a48:
  if (pcVar4 == (char *)0x0) {
LAB_00123a4d:
    puts("Error reading parameter : WaterFloorAltitude.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&WaterFloorAltitude);
  if (iVar2 != 1) {
    puts("Invalid parameter : WaterFloorAltitude.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123ac0;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123acc;
    }
    if (local_4c8 != 0x23) break;
LAB_00123ac0:
    if (pcVar4 == (char *)0x0) goto LAB_00123ad1;
  }
  if (local_4c8 == 0x24) goto LAB_00123ad1;
LAB_00123acc:
  if (pcVar4 == (char *)0x0) {
LAB_00123ad1:
    puts("Error reading parameter : nb_circles.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%d",&nb_circles);
  if (iVar2 != 1) {
    puts("Invalid parameter : nb_circles.");
  }
  if (0 < nb_circles) {
    iVar2 = 0;
LAB_00123b2f:
    do {
      pcVar4 = fgets((char *)&local_4c8,0x400,__stream);
      if (local_4c8 < 0x25) {
        if (local_4c8 == 0x23) goto LAB_00123b66;
        if (local_4c8 != 0x24) goto LAB_00123b72;
LAB_00123b77:
        puts("Error reading parameter : circles.");
      }
      else {
        if (local_4c8 == 0x25) {
LAB_00123b66:
          if (pcVar4 == (char *)0x0) goto LAB_00123b77;
          goto LAB_00123b2f;
        }
        if (((local_4c8 == 0x2f) && (pcVar4 != (char *)0x0)) && (local_4c7 == '/'))
        goto LAB_00123b2f;
LAB_00123b72:
        if (pcVar4 == (char *)0x0) goto LAB_00123b77;
      }
      iVar3 = __isoc99_sscanf(&local_4c8,"%lf %lf %lf",&local_520,&local_510,&local_518);
      if (iVar3 != 3) {
        puts("Invalid parameter : circles.");
      }
      if (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&circles_x,
                   (iterator)
                   circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_520);
      }
      else {
        *circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_520;
        circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&circles_y,
                   (iterator)
                   circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_510);
      }
      else {
        *circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_510;
        circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&circles_r,
                   (iterator)
                   circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_518);
      }
      else {
        *circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_518;
        circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < nb_circles);
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123c8b;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123c97;
    }
    if (local_4c8 != 0x23) break;
LAB_00123c8b:
    if (pcVar4 == (char *)0x0) goto LAB_00123c9c;
  }
  if (local_4c8 == 0x24) goto LAB_00123c9c;
LAB_00123c97:
  if (pcVar4 == (char *)0x0) {
LAB_00123c9c:
    puts("Error reading parameter : nb_walls.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%d",&nb_walls);
  if (iVar2 != 1) {
    puts("Invalid parameter : nb_walls.");
  }
  if (0 < nb_walls) {
    iVar2 = 0;
LAB_00123cf9:
    do {
      pcVar4 = fgets((char *)&local_4c8,0x400,__stream);
      if (local_4c8 < 0x25) {
        if (local_4c8 == 0x23) goto LAB_00123d30;
        if (local_4c8 != 0x24) goto LAB_00123d3c;
LAB_00123d41:
        puts("Error reading parameter : walls.");
      }
      else {
        if (local_4c8 == 0x25) {
LAB_00123d30:
          if (pcVar4 == (char *)0x0) goto LAB_00123d41;
          goto LAB_00123cf9;
        }
        if (((local_4c8 == 0x2f) && (pcVar4 != (char *)0x0)) && (local_4c7 == '/'))
        goto LAB_00123cf9;
LAB_00123d3c:
        if (pcVar4 == (char *)0x0) goto LAB_00123d41;
      }
      iVar3 = __isoc99_sscanf(&local_4c8,"%lf %lf %lf %lf",&local_520,&local_510,&local_518,
                              &local_508);
      if (iVar3 != 4) {
        puts("Invalid parameter : walls.");
      }
      if (walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&walls_xa,
                   (iterator)
                   walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_520);
      }
      else {
        *walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_520;
        walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&walls_ya,
                   (iterator)
                   walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_510);
      }
      else {
        *walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_510;
        walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&walls_xb,
                   (iterator)
                   walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_518);
      }
      else {
        *walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_518;
        walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&walls_yb,
                   (iterator)
                   walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_508);
      }
      else {
        *walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_508;
        walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < nb_walls);
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123e98;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123ea4;
    }
    if (local_4c8 != 0x23) break;
LAB_00123e98:
    if (pcVar4 == (char *)0x0) goto LAB_00123ea9;
  }
  if (local_4c8 == 0x24) goto LAB_00123ea9;
LAB_00123ea4:
  if (pcVar4 == (char *)0x0) {
LAB_00123ea9:
    puts("Error reading parameter : d0.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&local_520);
  if (iVar2 != 1) {
    puts("Invalid parameter : d0.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123f1a;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123f26;
    }
    if (local_4c8 != 0x23) break;
LAB_00123f1a:
    if (pcVar4 == (char *)0x0) goto LAB_00123f2b;
  }
  if (local_4c8 == 0x24) goto LAB_00123f2b;
LAB_00123f26:
  if (pcVar4 == (char *)0x0) {
LAB_00123f2b:
    puts("Error reading parameter : d1.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&local_510);
  if (iVar2 != 1) {
    puts("Invalid parameter : d1.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00123f9c;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00123fa8;
    }
    if (local_4c8 != 0x23) break;
LAB_00123f9c:
    if (pcVar4 == (char *)0x0) goto LAB_00123fad;
  }
  if (local_4c8 == 0x24) goto LAB_00123fad;
LAB_00123fa8:
  if (pcVar4 == (char *)0x0) {
LAB_00123fad:
    puts("Error reading parameter : d2.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&local_518);
  if (iVar2 != 1) {
    puts("Invalid parameter : d2.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_0012401e;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_0012402a;
    }
    if (local_4c8 != 0x23) break;
LAB_0012401e:
    if (pcVar4 == (char *)0x0) goto LAB_0012402f;
  }
  if (local_4c8 == 0x24) goto LAB_0012402f;
LAB_0012402a:
  if (pcVar4 == (char *)0x0) {
LAB_0012402f:
    puts("Error reading parameter : d3.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&local_508);
  if (iVar2 != 1) {
    puts("Invalid parameter : d3.");
  }
  interval::interval(&local_78,&local_520,&local_510);
  interval::interval(&local_90,&local_518,&local_508);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_78,
           (vector<interval,_std::allocator<interval>_> *)&local_90);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00124107;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_00124113;
    }
    if (local_4c8 != 0x23) break;
LAB_00124107:
    if (pcVar4 == (char *)0x0) goto LAB_00124118;
  }
  if (local_4c8 == 0x24) goto LAB_00124118;
LAB_00124113:
  if (pcVar4 == (char *)0x0) {
LAB_00124118:
    puts("Error reading parameter : csMap.xMin.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",&csMap);
  if (iVar2 != 1) {
    puts("Invalid parameter : csMap.xMin.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_0012418e;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_0012419a;
    }
    if (local_4c8 != 0x23) break;
LAB_0012418e:
    if (pcVar4 == (char *)0x0) goto LAB_0012419f;
  }
  if (local_4c8 == 0x24) goto LAB_0012419f;
LAB_0012419a:
  if (pcVar4 == (char *)0x0) {
LAB_0012419f:
    puts("Error reading parameter : csMap.xMax.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",0x2058f8);
  if (iVar2 != 1) {
    puts("Invalid parameter : csMap.xMax.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00124210;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_0012421c;
    }
    if (local_4c8 != 0x23) break;
LAB_00124210:
    if (pcVar4 == (char *)0x0) goto LAB_00124221;
  }
  if (local_4c8 == 0x24) goto LAB_00124221;
LAB_0012421c:
  if (pcVar4 == (char *)0x0) {
LAB_00124221:
    puts("Error reading parameter : csMap.yMin.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",0x205900);
  if (iVar2 != 1) {
    puts("Invalid parameter : csMap.yMin.");
  }
  while( true ) {
    while (pcVar4 = fgets((char *)&local_4c8,0x400,__stream), 0x24 < local_4c8) {
      if (local_4c8 == 0x25) goto LAB_00124292;
      if (((local_4c8 != 0x2f) || (pcVar4 == (char *)0x0)) || (local_4c7 != '/')) goto LAB_0012429e;
    }
    if (local_4c8 != 0x23) break;
LAB_00124292:
    if (pcVar4 == (char *)0x0) goto LAB_001242a3;
  }
  if (local_4c8 == 0x24) goto LAB_001242a3;
LAB_0012429e:
  if (pcVar4 == (char *)0x0) {
LAB_001242a3:
    puts("Error reading parameter : csMap.yMax.");
  }
  iVar2 = __isoc99_sscanf(&local_4c8,"%lf",0x205908);
  if (iVar2 != 1) {
    puts("Invalid parameter : csMap.yMax.");
  }
  iVar2 = fclose(__stream);
  if (iVar2 != 0) {
    puts("fclose() failed.");
  }
  if (180.0 < ABS(MagneticDeclination)) {
    puts("Invalid parameter : MagneticDeclination.");
    MagneticDeclination = 0.0;
  }
  if ((AirPressure < 0.0) || (1000.0 < AirPressure)) {
    puts("Invalid parameter : AirPressure.");
    AirPressure = 1.0;
  }
  if ((WaterVelocityOfSound < 200.0) || (2000.0 < WaterVelocityOfSound)) {
    puts("Invalid parameter : WaterVelocityOfSound.");
    WaterVelocityOfSound = 1500.0;
  }
  if ((((nb_circles < 0) ||
       (nb_circles !=
        (int)((ulong)((long)circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3))) ||
      (nb_circles !=
       (int)((ulong)((long)circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     (nb_circles !=
      (int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3))) {
    puts("Invalid parameter : nb_circles.");
    nb_circles = 0;
    if (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  if (((nb_walls < 0) ||
      (nb_walls !=
       (int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     ((nb_walls !=
       (int)((ulong)((long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) ||
      ((nb_walls !=
        (int)((ulong)((long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) ||
       (nb_walls !=
        (int)((ulong)((long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3))))))) {
    puts("Invalid parameter : nb_walls.");
    nb_walls = 0;
    if (walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  bVar1 = box::IsEmpty(&box_env);
  if (!bVar1) {
    piVar5 = box::operator[](&box_env,1);
    local_4f0 = piVar5->inf;
    piVar5 = box::operator[](&box_env,1);
    if (local_4f0 < piVar5->sup) {
      piVar5 = box::operator[](&box_env,2);
      local_4f0 = piVar5->inf;
      piVar5 = box::operator[](&box_env,2);
      if (local_4f0 < piVar5->sup) goto LAB_00124603;
    }
  }
  puts("Invalid parameter : box_env.");
  local_4d0 = -10.0;
  local_4d8 = 10.0;
  interval::interval(&local_a8,&local_4d0,&local_4d8);
  local_4e0 = -10.0;
  local_4e8 = 10.0;
  interval::interval(&local_c0,&local_4e0,&local_4e8);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_a8,
           (vector<interval,_std::allocator<interval>_> *)&local_c0);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
LAB_00124603:
  if ((csMap.xMin != csMap.xMax) || (NAN(csMap.xMin) || NAN(csMap.xMax))) {
    if (csMap.yMin != csMap.yMax) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
    if (NAN(csMap.yMin) || NAN(csMap.yMax)) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
  }
  puts("Invalid parameter : csMap.");
  csMap.yMax = 10.0;
  csMap.yMin = -10.0;
  csMap.xMax = 10.0;
  csMap.xMin = -10.0;
  alt_home = alt_env;
  long_home = long_env;
  lat_home = lat_env;
  return 0;
}

Assistant:

inline int LoadEnv(void)
{
	FILE* file = NULL;
	char line[1024];
	int i = 0;
	double d0 = 0, d1 = 0, d2 = 0, d3 = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	// Default values.
	angle_env = M_PI/2.0-90.0*M_PI/180.0;
	lat_env = 0;
	long_env = 0;
	alt_env = 0;
	MagneticDeclination = 0;
	AirPressure = 1;
	WaterVelocityOfSound = 1500;
	WaterFloorAltitude = 0;
	nb_circles = 0;
	circles_x.clear();
	circles_y.clear();
	circles_r.clear();
	nb_walls = 0;
	walls_xa.clear();
	walls_ya.clear();
	walls_xb.clear();
	walls_yb.clear();
	box_env = box(interval(-10,10),interval(-10,10));
	csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 

	file = fopen("env.txt", "r");
	if (file != NULL)
	{
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		angle_env = M_PI/2.0-d0*M_PI/180.0;

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : lat_env.\n");
		if (sscanf(line, "%lf", &lat_env) != 1) printf("Invalid parameter : lat_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : long_env.\n");
		if (sscanf(line, "%lf", &long_env) != 1) printf("Invalid parameter : long_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : alt_env.\n");
		if (sscanf(line, "%lf", &alt_env) != 1) printf("Invalid parameter : alt_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : MagneticDeclination.\n");
		if (sscanf(line, "%lf", &MagneticDeclination) != 1) printf("Invalid parameter : MagneticDeclination.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : AirPressure.\n");
		if (sscanf(line, "%lf", &AirPressure) != 1) printf("Invalid parameter : AirPressure.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterVelocityOfSound.\n");
		if (sscanf(line, "%lf", &WaterVelocityOfSound) != 1) printf("Invalid parameter : WaterVelocityOfSound.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterFloorAltitude.\n");
		if (sscanf(line, "%lf", &WaterFloorAltitude) != 1) printf("Invalid parameter : WaterFloorAltitude.\n");

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_circles.\n");
		if (sscanf(line, "%d", &nb_circles) != 1) printf("Invalid parameter : nb_circles.\n");
		for (i = 0; i < nb_circles; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : circles.\n");
			if (sscanf(line, "%lf %lf %lf", &d0, &d1, &d2) != 3) printf("Invalid parameter : circles.\n");
			circles_x.push_back(d0);
			circles_y.push_back(d1);
			circles_r.push_back(d2);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_walls.\n");
		if (sscanf(line, "%d", &nb_walls) != 1) printf("Invalid parameter : nb_walls.\n");
		for (i = 0; i < nb_walls; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : walls.\n");
			if (sscanf(line, "%lf %lf %lf %lf", &d0, &d1, &d2, &d3) != 4) printf("Invalid parameter : walls.\n");
			walls_xa.push_back(d0);
			walls_ya.push_back(d1);
			walls_xb.push_back(d2);
			walls_yb.push_back(d3);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d1.\n");
		if (sscanf(line, "%lf", &d1) != 1) printf("Invalid parameter : d1.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d2.\n");
		if (sscanf(line, "%lf", &d2) != 1) printf("Invalid parameter : d2.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d3.\n");
		if (sscanf(line, "%lf", &d3) != 1) printf("Invalid parameter : d3.\n");
		box_env = box(interval(d0,d1),interval(d2,d3));

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMin.\n");
		if (sscanf(line, "%lf", &csMap.xMin) != 1) printf("Invalid parameter : csMap.xMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMax.\n");
		if (sscanf(line, "%lf", &csMap.xMax) != 1) printf("Invalid parameter : csMap.xMax.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMin.\n");
		if (sscanf(line, "%lf", &csMap.yMin) != 1) printf("Invalid parameter : csMap.yMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMax.\n");
		if (sscanf(line, "%lf", &csMap.yMax) != 1) printf("Invalid parameter : csMap.yMax.\n");

		if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
	}
	else
	{
		printf("Configuration file not found.\n");
		return EXIT_FAILURE;
	}
#pragma region Parameters check
	if ((MagneticDeclination < -180)||(MagneticDeclination > 180))
	{
		printf("Invalid parameter : MagneticDeclination.\n");
		MagneticDeclination = 0;
	}
	if ((AirPressure < 0)||(AirPressure > 1000))
	{
		printf("Invalid parameter : AirPressure.\n");
		AirPressure = 1;
	}
	if ((WaterVelocityOfSound < 200)||(WaterVelocityOfSound > 2000))
	{
		printf("Invalid parameter : WaterVelocityOfSound.\n");
		WaterVelocityOfSound = 1500;
	}
	if ((nb_circles < 0)||((int)circles_x.size() != nb_circles)||((int)circles_y.size() != nb_circles)||((int)circles_r.size() != nb_circles))
	{
		printf("Invalid parameter : nb_circles.\n");
		nb_circles = 0;
		circles_x.clear(); circles_y.clear(); circles_r.clear();
	}
	if ((nb_walls < 0)||((int)walls_xa.size() != nb_walls)||((int)walls_ya.size() != nb_walls)||((int)walls_xb.size() != nb_walls)||((int)walls_yb.size() != nb_walls))
	{
		printf("Invalid parameter : nb_walls.\n");
		nb_walls = 0;
		walls_xa.clear(); walls_ya.clear(); walls_xb.clear(); walls_yb.clear();
	}
	if ((box_env.IsEmpty())||(box_env[1].inf >= box_env[1].sup)||(box_env[2].inf >= box_env[2].sup))
	{
		printf("Invalid parameter : box_env.\n");
		box_env = box(interval(-10,10),interval(-10,10));
	}
	if ((csMap.xMin == csMap.xMax)||(csMap.yMin == csMap.yMax))
	{
		printf("Invalid parameter : csMap.\n");
		csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 
	}
#pragma endregion
	lat_home = lat_env; long_home = long_env; alt_home = alt_env;

	return EXIT_SUCCESS;
}